

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsDefs.cpp
# Opt level: O0

void __thiscall xs::Error::Error(Error *this,char *message,char *expr,char *file,int line)

{
  int in_R9D;
  string local_50;
  int local_2c;
  char *pcStack_28;
  int line_local;
  char *file_local;
  char *expr_local;
  char *message_local;
  Error *this_local;
  
  local_2c = line;
  pcStack_28 = file;
  file_local = expr;
  expr_local = message;
  message_local = (char *)this;
  formatError_abi_cxx11_(&local_50,(xs *)message,expr,file,(char *)(ulong)(uint)line,in_R9D);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)this = &PTR__Error_00114b80;
  return;
}

Assistant:

Error::Error (const char* message, const char* expr, const char* file, int line)
	: std::runtime_error(formatError(message, expr, file, line))
{
}